

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::LSTM_x86_fma::forward(LSTM_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  _func_int *p_Var2;
  int *piVar3;
  int iVar4;
  void *__src;
  size_t sVar5;
  ulong uVar6;
  void *__dest;
  bool bVar7;
  Mat m_2;
  int local_21c;
  Mat m_4;
  Mat m;
  Mat m_1;
  Mat m_5;
  Mat local_c8;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = *(int *)(&this->field_0xd8 + (long)this->_vptr_LSTM_x86_fma[-3]);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),4,
              opt->workspace_allocator);
  iVar4 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_003b89a0;
  if (0 < local_78.c * (int)local_78.cstep) {
    memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),4,
              opt->workspace_allocator);
  iVar4 = -100;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    if (0 < local_c8.c * (int)local_c8.cstep) {
      memset(local_c8.data,0,(ulong)(uint)(local_c8.c * (int)local_c8.cstep) << 2);
    }
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]) <<
                         (iVar1 == 2),_h,4,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var2 = this->_vptr_LSTM_x86_fma[-3];
      if (*(uint *)(&this->field_0xd8 + (long)p_Var2) < 2) {
        m.w = *(int *)(&this->field_0x154 + (long)p_Var2);
        m.h = *(int *)(&this->field_0x158 + (long)p_Var2);
        m.c = *(int *)(&this->field_0x15c + (long)p_Var2);
        m.data = *(void **)(&this->field_0x128 + (long)p_Var2);
        uVar6 = *(ulong *)(&this->field_0x138 + (long)p_Var2);
        m.elempack = *(int *)(&this->field_0x140 + (long)p_Var2);
        m.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var2);
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar6;
        m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m.d = 1;
        m.dims = *(int *)(&this->field_0x150 + (long)p_Var2) + -1;
        m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (*(int *)(&this->field_0x150 + (long)p_Var2) == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        m_1.w = *(int *)(&this->field_0x19c + (long)p_Var2);
        m_1.h = *(int *)(&this->field_0x1a0 + (long)p_Var2);
        m_1.c = *(int *)(&this->field_0x1a4 + (long)p_Var2);
        m_1.data = *(void **)(&this->field_0x170 + (long)p_Var2);
        uVar6 = *(ulong *)(&this->field_0x180 + (long)p_Var2);
        m_1.elempack = *(int *)(&this->field_0x188 + (long)p_Var2);
        m_1.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var2);
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)uVar6;
        m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_1.d = 1;
        m_1.dims = *(int *)(&this->field_0x198 + (long)p_Var2) + -1;
        m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (*(int *)(&this->field_0x198 + (long)p_Var2) == 4) {
          m_1.cstep = (long)m_1.h * (long)m_1.w;
        }
        m_2.c = *(int *)(&this->field_0x114 + (long)p_Var2);
        m_2.data = *(void **)(&this->field_0xe0 + (long)p_Var2);
        uVar6 = *(ulong *)(&this->field_0xf0 + (long)p_Var2);
        m_2.elempack = *(int *)(&this->field_0xf8 + (long)p_Var2);
        m_2.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var2);
        m_2.refcount._0_4_ = 0;
        m_2.refcount._4_4_ = 0;
        m_2.elemsize._0_4_ = (undefined4)uVar6;
        m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_2.d = 1;
        m_2.h = *(int *)(&this->field_0x110 + (long)p_Var2);
        sVar5 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) *
                (long)*(int *)(&this->field_0x10c + (long)p_Var2);
        m_2.w = *(int *)(&this->field_0x10c + (long)p_Var2);
        m_2.dims = *(int *)(&this->field_0x108 + (long)p_Var2) + -1;
        m_2.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
        if (*(int *)(&this->field_0x108 + (long)p_Var2) == 4) {
          m_2.cstep = sVar5;
        }
        iVar4 = lstm(bottom_blob,top_blob,*(uint *)(&this->field_0xd8 + (long)p_Var2),&m,&m_1,&m_2,
                     &local_78,&local_c8,opt);
        m_2.cstep = 0;
        m_2.data = (void *)0x0;
        m_2.refcount._0_4_ = 0;
        m_2.refcount._4_4_ = 0;
        m_2.elemsize._0_4_ = 0;
        m_2.elemsize._4_4_ = 0;
        m_2.elempack = 0;
        m_2.dims = 0;
        m_2.w = 0;
        m_2.h = 0;
        m_2.d = 0;
        m_2.c = 0;
        piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        local_21c = iVar4;
        if (iVar4 != 0) goto LAB_003b892f;
      }
      if (*(int *)(&this->field_0xd8 + (long)this->_vptr_LSTM_x86_fma[-3]) == 2) {
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.allocator = (Allocator *)0x0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        Mat::create(&m,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),_h,4,
                    opt->workspace_allocator);
        iVar4 = -100;
        if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
          bVar7 = false;
        }
        else {
          m_1.cstep = 0;
          m_1.data = (void *)0x0;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = 0;
          m_1.elemsize._4_4_ = 0;
          m_1.elempack = 0;
          m_1.allocator = (Allocator *)0x0;
          m_1.dims = 0;
          m_1.w = 0;
          m_1.h = 0;
          m_1.d = 0;
          m_1.c = 0;
          Mat::create(&m_1,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]),_h,4,
                      opt->workspace_allocator);
          iVar4 = -100;
          if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
LAB_003b84dc:
            bVar7 = false;
          }
          else {
            p_Var2 = this->_vptr_LSTM_x86_fma[-3];
            m_2.c = *(int *)(&this->field_0x15c + (long)p_Var2);
            m_2.data = *(void **)(&this->field_0x128 + (long)p_Var2);
            uVar6 = *(ulong *)(&this->field_0x138 + (long)p_Var2);
            m_2.elempack = *(int *)(&this->field_0x140 + (long)p_Var2);
            m_2.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var2);
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = (undefined4)uVar6;
            m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_2.d = 1;
            m_2.h = *(int *)(&this->field_0x158 + (long)p_Var2);
            sVar5 = (long)*(int *)(&this->field_0x158 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x154 + (long)p_Var2);
            m_2.w = *(int *)(&this->field_0x154 + (long)p_Var2);
            m_2.dims = *(int *)(&this->field_0x150 + (long)p_Var2) + -1;
            m_2.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (*(int *)(&this->field_0x150 + (long)p_Var2) == 4) {
              m_2.cstep = sVar5;
            }
            m_4.c = *(int *)(&this->field_0x1a4 + (long)p_Var2);
            m_4.data = *(void **)(&this->field_0x170 + (long)p_Var2);
            uVar6 = *(ulong *)(&this->field_0x180 + (long)p_Var2);
            m_4.elempack = *(int *)(&this->field_0x188 + (long)p_Var2);
            m_4.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var2);
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = (undefined4)uVar6;
            m_4.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_4.d = 1;
            m_4.h = *(int *)(&this->field_0x1a0 + (long)p_Var2);
            sVar5 = (long)*(int *)(&this->field_0x1a0 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x19c + (long)p_Var2);
            m_4.w = *(int *)(&this->field_0x19c + (long)p_Var2);
            m_4.dims = *(int *)(&this->field_0x198 + (long)p_Var2) + -1;
            m_4.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (*(int *)(&this->field_0x198 + (long)p_Var2) == 4) {
              m_4.cstep = sVar5;
            }
            m_5.c = *(int *)(&this->field_0x114 + (long)p_Var2);
            m_5.data = *(void **)(&this->field_0xe0 + (long)p_Var2);
            uVar6 = *(ulong *)(&this->field_0xf0 + (long)p_Var2);
            m_5.elempack = *(int *)(&this->field_0xf8 + (long)p_Var2);
            m_5.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var2);
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = (undefined4)uVar6;
            m_5.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_5.d = 1;
            m_5.h = *(int *)(&this->field_0x110 + (long)p_Var2);
            sVar5 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x10c + (long)p_Var2);
            m_5.w = *(int *)(&this->field_0x10c + (long)p_Var2);
            m_5.dims = *(int *)(&this->field_0x108 + (long)p_Var2) + -1;
            m_5.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (*(int *)(&this->field_0x108 + (long)p_Var2) == 4) {
              m_5.cstep = sVar5;
            }
            iVar4 = lstm(bottom_blob,&m,0,&m_2,&m_4,&m_5,&local_78,&local_c8,opt);
            m_5.cstep = 0;
            m_5.data = (void *)0x0;
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = 0;
            m_5.elemsize._4_4_ = 0;
            m_5.elempack = 0;
            m_5.dims = 0;
            m_5.w = 0;
            m_5.h = 0;
            m_5.d = 0;
            m_5.c = 0;
            piVar3 = (int *)CONCAT44(m_4.refcount._4_4_,m_4.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_4.allocator == (Allocator *)0x0) {
                  if (m_4.data != (void *)0x0) {
                    free(m_4.data);
                  }
                }
                else {
                  (*(m_4.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_4.cstep = 0;
            m_4.data = (void *)0x0;
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = 0;
            m_4.elemsize._4_4_ = 0;
            m_4.elempack = 0;
            m_4.dims = 0;
            m_4.w = 0;
            m_4.h = 0;
            m_4.d = 0;
            m_4.c = 0;
            piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_2.allocator == (Allocator *)0x0) {
                  if (m_2.data != (void *)0x0) {
                    free(m_2.data);
                  }
                }
                else {
                  (*(m_2.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_2.cstep = 0;
            m_2.data = (void *)0x0;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = 0;
            m_2.elemsize._4_4_ = 0;
            m_2.elempack = 0;
            m_2.dims = 0;
            m_2.w = 0;
            m_2.h = 0;
            m_2.d = 0;
            m_2.c = 0;
            if (iVar4 != 0) goto LAB_003b84dc;
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < local_c8.c * (int)local_c8.cstep) {
              memset(local_c8.data,0,(ulong)(uint)(local_c8.c * (int)local_c8.cstep) << 2);
            }
            p_Var2 = this->_vptr_LSTM_x86_fma[-3];
            m_2.c = *(int *)(&this->field_0x15c + (long)p_Var2);
            uVar6 = *(ulong *)(&this->field_0x138 + (long)p_Var2);
            m_2.data = (void *)(*(long *)(&this->field_0x168 + (long)p_Var2) * uVar6 +
                               *(long *)(&this->field_0x128 + (long)p_Var2));
            m_2.elempack = *(int *)(&this->field_0x140 + (long)p_Var2);
            m_2.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var2);
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = (undefined4)uVar6;
            m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_2.d = 1;
            m_2.h = *(int *)(&this->field_0x158 + (long)p_Var2);
            sVar5 = (long)*(int *)(&this->field_0x158 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x154 + (long)p_Var2);
            m_2.w = *(int *)(&this->field_0x154 + (long)p_Var2);
            m_2.dims = *(int *)(&this->field_0x150 + (long)p_Var2) + -1;
            m_2.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (*(int *)(&this->field_0x150 + (long)p_Var2) == 4) {
              m_2.cstep = sVar5;
            }
            m_4.c = *(int *)(&this->field_0x1a4 + (long)p_Var2);
            uVar6 = *(ulong *)(&this->field_0x180 + (long)p_Var2);
            m_4.data = (void *)(*(long *)(&this->field_0x1b0 + (long)p_Var2) * uVar6 +
                               *(long *)(&this->field_0x170 + (long)p_Var2));
            m_4.elempack = *(int *)(&this->field_0x188 + (long)p_Var2);
            m_4.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var2);
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = (undefined4)uVar6;
            m_4.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_4.d = 1;
            m_4.h = *(int *)(&this->field_0x1a0 + (long)p_Var2);
            sVar5 = (long)*(int *)(&this->field_0x1a0 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x19c + (long)p_Var2);
            m_4.w = *(int *)(&this->field_0x19c + (long)p_Var2);
            m_4.dims = *(int *)(&this->field_0x198 + (long)p_Var2) + -1;
            m_4.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (*(int *)(&this->field_0x198 + (long)p_Var2) == 4) {
              m_4.cstep = sVar5;
            }
            m_5.c = *(int *)(&this->field_0x114 + (long)p_Var2);
            uVar6 = *(ulong *)(&this->field_0xf0 + (long)p_Var2);
            m_5.data = (void *)(*(long *)(&this->field_0x120 + (long)p_Var2) * uVar6 +
                               *(long *)(&this->field_0xe0 + (long)p_Var2));
            m_5.elempack = *(int *)(&this->field_0xf8 + (long)p_Var2);
            m_5.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var2);
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = (undefined4)uVar6;
            m_5.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_5.d = 1;
            m_5.h = *(int *)(&this->field_0x110 + (long)p_Var2);
            sVar5 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) *
                    (long)*(int *)(&this->field_0x10c + (long)p_Var2);
            m_5.w = *(int *)(&this->field_0x10c + (long)p_Var2);
            m_5.dims = *(int *)(&this->field_0x108 + (long)p_Var2) + -1;
            m_5.cstep = (uVar6 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar6;
            if (*(int *)(&this->field_0x108 + (long)p_Var2) == 4) {
              m_5.cstep = sVar5;
            }
            iVar4 = lstm(bottom_blob,&m_1,1,&m_2,&m_4,&m_5,&local_78,&local_c8,opt);
            m_5.cstep = 0;
            m_5.data = (void *)0x0;
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = 0;
            m_5.elemsize._4_4_ = 0;
            m_5.elempack = 0;
            m_5.dims = 0;
            m_5.w = 0;
            m_5.h = 0;
            m_5.d = 0;
            m_5.c = 0;
            piVar3 = (int *)CONCAT44(m_4.refcount._4_4_,m_4.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_4.allocator == (Allocator *)0x0) {
                  if (m_4.data != (void *)0x0) {
                    free(m_4.data);
                  }
                }
                else {
                  (*(m_4.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_4.cstep = 0;
            m_4.data = (void *)0x0;
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = 0;
            m_4.elemsize._4_4_ = 0;
            m_4.elempack = 0;
            m_4.dims = 0;
            m_4.w = 0;
            m_4.h = 0;
            m_4.d = 0;
            m_4.c = 0;
            piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_2.allocator == (Allocator *)0x0) {
                  if (m_2.data != (void *)0x0) {
                    free(m_2.data);
                  }
                }
                else {
                  (*(m_2.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_2.cstep = 0;
            m_2.data = (void *)0x0;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = 0;
            m_2.elemsize._4_4_ = 0;
            m_2.elempack = 0;
            m_2.dims = 0;
            m_2.w = 0;
            m_2.h = 0;
            m_2.d = 0;
            m_2.c = 0;
            bVar7 = iVar4 == 0;
            if ((bVar7) && (iVar4 = local_21c, 0 < (int)_h)) {
              uVar6 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar6 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)top_blob->w * uVar6 * top_blob->elemsize +
                                 (long)top_blob->data);
                memcpy(__dest,(void *)((long)m.w * uVar6 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),
                       (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]) << 2);
                memcpy((void *)((long)__dest +
                               (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]
                                             ) * 4),__src,
                       (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_fma[-3]) << 2);
                uVar6 = uVar6 + 1;
              } while (_h != uVar6);
            }
          }
          piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_1.cstep = 0;
          m_1.data = (void *)0x0;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = 0;
          m_1.elemsize._4_4_ = 0;
          m_1.elempack = 0;
          m_1.dims = 0;
          m_1.w = 0;
          m_1.h = 0;
          m_1.d = 0;
          m_1.c = 0;
        }
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        if (!bVar7) goto LAB_003b892f;
      }
      iVar4 = 0;
    }
  }
LAB_003b892f:
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
LAB_003b89a0:
  piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if __AVX__
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);
    // internal cell state
    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);
        cell.fill(0.0f);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, cell, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
#else
    return LSTM::forward(bottom_blob, top_blob, opt);
#endif
}